

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O2

ssize_t __thiscall Samba::write(Samba *this,int __fd,void *__buf,size_t __n)

{
  SerialPort *pSVar1;
  int iVar2;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar3;
  undefined8 *puVar4;
  uint8_t cmd [20];
  
  if (this->_debug == true) {
    printf("%s(addr=%#x,size=%#x)\n","write",__fd,__n & 0xffffffff);
  }
  snprintf((char *)cmd,0x14,"S%08X,%08X#",__fd,__n & 0xffffffff);
  pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
           _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
           super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
  iVar2 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,cmd,0x13);
  if (iVar2 == 0x13) {
    if (this->_isUsb == true) {
      (*((this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t
         .super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
         super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl)->_vptr_SerialPort[10])();
      writeBinary(this,(uint8_t *)__buf,(int)__n);
      sVar3 = extraout_RAX;
    }
    else {
      writeXmodem(this,(uint8_t *)__buf,(int)__n);
      sVar3 = extraout_RAX_00;
    }
    return sVar3;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_001175a0;
  __cxa_throw(puVar4,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

void
Samba::write(uint32_t addr, const uint8_t* buffer, int size)
{
    uint8_t cmd[20];

    if (_debug)
        printf("%s(addr=%#x,size=%#x)\n", __FUNCTION__, addr, size);

    snprintf((char*) cmd, sizeof(cmd), "S%08X,%08X#", addr, size);
    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
        throw SambaError();

    // The SAM firmware has a bug that if the command and binary data
    // are received in the same USB data packet, then the firmware
    // gets confused.  Even though the writes are separated in the code,
    // USB drivers often do write combining which can put them together
    // in the same USB data packet.  To avoid this, we call the serial
    // port object's flush method before writing the data.
    if (_isUsb)
    {
        _port->flush();
        writeBinary(buffer, size);
    }
    else
    {
        writeXmodem(buffer, size);
    }
}